

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sales.cpp
# Opt level: O0

void __thiscall
L15_4::LabeledSales::NBadIndex::NBadIndex(NBadIndex *this,string *lb,int ix,string *s)

{
  string *s_local;
  int ix_local;
  string *lb_local;
  NBadIndex *this_local;
  
  Sales::BadIndex::BadIndex(&this->super_BadIndex,ix,s);
  *(undefined ***)&this->super_BadIndex = &PTR__NBadIndex_0015fb30;
  std::__cxx11::string::string((string *)&this->_lbl);
  std::__cxx11::string::operator=((string *)&this->_lbl,(string *)lb);
  return;
}

Assistant:

LabeledSales::NBadIndex::NBadIndex(const std::string & lb, int ix, const std::string &s): Sales::BadIndex(ix, s) {
        _lbl = lb;
    }